

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall SSTableCache::SSTableCache(SSTableCache *this,string *_fileName)

{
  string *__rhs;
  uint64_t *n;
  runtime_error *this_00;
  uint64_t i;
  ulong uVar1;
  int offset;
  ifstream in;
  byte abStack_2a18 [488];
  uint64_t key;
  
  __rhs = &this->fileName;
  memset(this,0,0x2838);
  std::__cxx11::string::string((string *)__rhs,(string *)_fileName);
  std::ifstream::ifstream(&in,(string *)__rhs,_S_in|_S_bin);
  if ((abStack_2a18[*(long *)(_in + -0x18)] & 5) == 0) {
    SSTable::read64(&in,(uint64_t *)this);
    n = &(this->header).length;
    SSTable::read64(&in,n);
    SSTable::read64(&in,&(this->header).minKey);
    SSTable::read64(&in,&(this->header).maxKey);
    BloomFilter::BloomFilter((BloomFilter *)&key,&in);
    memcpy(&this->bloomFilter,&key,0x2800);
    std::istream::seekg((long)&in,0x2820);
    for (uVar1 = 0; uVar1 < *n; uVar1 = uVar1 + 1) {
      SSTable::read64(&in,&key);
      SSTable::read32(&in,&offset);
      std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
      emplace_back<unsigned_long&,int&>
                ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                  *)&this->index,&key,&offset);
    }
    SSTable::read64(&in,&key);
    SSTable::read32(&in,&offset);
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long&,int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,&key,&offset);
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                 "readHeader: Open file ",__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                 " failed!");
  std::runtime_error::runtime_error(this_00,(string *)&key);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SSTableCache::SSTableCache(string _fileName) : fileName(std::move(_fileName)) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readHeader: Open file " + fileName + " failed!");

  SSTable::read64(in, header.timeStamp);
  SSTable::read64(in, header.length);
  SSTable::read64(in, header.minKey);
  SSTable::read64(in, header.maxKey);

  bloomFilter = BloomFilter(in);

  in.seekg(32 + 10240, ifstream::beg);

  uint64_t key;
  int offset;
  for (uint64_t i = 0; i < header.length; i++) {
    SSTable::read64(in, key);
    SSTable::read32(in, offset);
    index.emplace_back(key, offset);
  }
  SSTable::read64(in, key);
  SSTable::read32(in, offset);
  index.emplace_back(key, offset);

  in.close();
}